

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_normalize(quaternion *self)

{
  short sVar1;
  float f1;
  float mag;
  quaternion *self_local;
  
  f1 = quaternion_magnitude(self);
  sVar1 = scalar_equalsf(f1,0.0);
  if (sVar1 == 0) {
    (self->field_0).q[0] = (self->field_0).q[0] / f1;
    (self->field_0).q[1] = (self->field_0).q[1] / f1;
    (self->field_0).q[2] = (self->field_0).q[2] / f1;
    (self->field_0).q[3] = (self->field_0).q[3] / f1;
  }
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_normalize(struct quaternion *self)
{
	HYP_FLOAT mag;

	mag = quaternion_magnitude(self);

	if (scalar_equalsf(mag, 0.0f)) {
		/* can't normalize a zero
		 * avoid divide by zero
		 */
		return self;
	}

	self->x /= mag;
	self->y /= mag;
	self->z /= mag;
	self->w /= mag;

	return self;
}